

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1ccb39::PeerManagerImpl::NewPoWValidBlock
          (PeerManagerImpl *this,CBlockIndex *pindex,shared_ptr<const_CBlock> *pblock)

{
  long lVar1;
  element_type *peVar2;
  pointer psVar3;
  CConnman *this_00;
  __single_object __p;
  bool bVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  _Result<CSerializedNetMsg> *this_01;
  shared_ptr<const_CTransaction> *tx;
  pointer __args_1;
  _State_baseV2 *__tmp;
  long in_FS_OFFSET;
  __basic_future<CSerializedNetMsg> local_158;
  element_type *local_148;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_140;
  shared_ptr<const_CBlockHeaderAndShortTxIDs> pcmpctblock;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_120;
  __single_object most_recent_block_txs;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_110 [2];
  __allocator_type __a2;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock43;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock42;
  uint256 hashBlock;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  peVar2 = (pblock->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  FastRandomContext::FastRandomContext((FastRandomContext *)&hashBlock,false);
  criticalblock43.super_unique_lock._M_device =
       (mutex_type *)FastRandomContext::rand64((FastRandomContext *)&hashBlock);
  std::make_shared<CBlockHeaderAndShortTxIDs_const,CBlock_const&,unsigned_long>
            ((CBlock *)&pcmpctblock,(unsigned_long *)peVar2);
  ChaCha20::~ChaCha20((ChaCha20 *)(hashBlock.super_base_blob<256U>.m_data._M_elems + 0x10));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock42,&cs_main,"cs_main",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
             ,0x897,false);
  if (this->m_highest_fast_announce < pindex->nHeight) {
    this->m_highest_fast_announce = pindex->nHeight;
    bVar4 = DeploymentActiveAt<Consensus::BuriedDeployment>
                      (pindex,this->m_chainman,DEPLOYMENT_SEGWIT);
    if (bVar4) {
      CBlockHeader::GetHash
                (&hashBlock,
                 &((pblock->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                  super_CBlockHeader);
      most_recent_block_txs._M_t.
      super___uniq_ptr_impl<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>,_std::default_delete<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_*,_std::default_delete<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>_>
      .
      super__Head_base<0UL,_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>,_std::default_delete<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>,_std::default_delete<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>_>
              )0x0;
      a_Stack_110[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x40);
      criticalblock43.super_unique_lock._M_device = (mutex_type *)&__a2;
      p_Var5->_M_use_count = 1;
      p_Var5->_M_weak_count = 1;
      p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00a20e80;
      p_Var5[1]._M_use_count = 0;
      p_Var5[1]._M_weak_count = 0;
      *(undefined4 *)&p_Var5[2]._vptr__Sp_counted_base = 0;
      *(undefined1 *)((long)&p_Var5[2]._vptr__Sp_counted_base + 4) = 0;
      p_Var5[2]._M_use_count = 0;
      p_Var5[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Deferred_state_00a20ed0;
      criticalblock43.super_unique_lock._8_8_ = p_Var5;
      this_01 = (_Result<CSerializedNetMsg> *)operator_new(0x50);
      std::__future_base::_Result<CSerializedNetMsg>::_Result(this_01);
      p_Var5[3]._vptr__Sp_counted_base = (_func_int **)this_01;
      *(shared_ptr<const_CBlockHeaderAndShortTxIDs> **)&p_Var5[3]._M_use_count = &pcmpctblock;
      criticalblock43.super_unique_lock._M_owns = false;
      criticalblock43.super_unique_lock._9_7_ = 0;
      std::
      __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp:2209:43)>_>,_CSerializedNetMsg>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp:2209:43)>_>,_CSerializedNetMsg>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
      ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_net_processing_cpp:2209:43)>_>,_CSerializedNetMsg>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_net_processing_cpp:2209:43)>_>,_CSerializedNetMsg>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                          *)&criticalblock43);
      _Stack_120._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      criticalblock43.super_unique_lock._M_device =
           (mutex_type *)
           most_recent_block_txs._M_t.
           super___uniq_ptr_impl<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>,_std::default_delete<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_*,_std::default_delete<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>_>
           .
           super__Head_base<0UL,_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_*,_false>
           ._M_head_impl;
      criticalblock43.super_unique_lock._8_8_ = a_Stack_110[0]._M_pi;
      most_recent_block_txs._M_t.
      super___uniq_ptr_impl<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>,_std::default_delete<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_*,_std::default_delete<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>_>
      .
      super__Head_base<0UL,_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>,_std::default_delete<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>,_true,_true>
            )(__uniq_ptr_data<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>,_std::default_delete<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>,_true,_true>
              )(p_Var5 + 1);
      a_Stack_110[0]._M_pi = p_Var5;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &criticalblock43.super_unique_lock._M_owns);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_120);
      std::__basic_future<CSerializedNetMsg>::__basic_future
                (&local_158,(__state_type *)&most_recent_block_txs);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_110);
      local_148 = local_158._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
      _Stack_140._M_pi =
           local_158._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      local_158._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_158._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_158._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::
      make_unique<std::map<uint256,std::shared_ptr<CTransaction_const>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::shared_ptr<CTransaction_const>>>>>
                ();
      peVar2 = (pblock->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      psVar3 = (peVar2->vtx).
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (__args_1 = (peVar2->vtx).
                      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; __args_1 != psVar3;
          __args_1 = __args_1 + 1) {
        std::
        _Rb_tree<uint256,std::pair<uint256_const,std::shared_ptr<CTransaction_const>>,std::_Select1st<std::pair<uint256_const,std::shared_ptr<CTransaction_const>>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::shared_ptr<CTransaction_const>>>>
        ::
        _M_emplace_unique<transaction_identifier<false>const&,std::shared_ptr<CTransaction_const>const&>
                  ((_Rb_tree<uint256,std::pair<uint256_const,std::shared_ptr<CTransaction_const>>,std::_Select1st<std::pair<uint256_const,std::shared_ptr<CTransaction_const>>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::shared_ptr<CTransaction_const>>>>
                    *)most_recent_block_txs._M_t.
                      super___uniq_ptr_impl<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>,_std::default_delete<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_*,_std::default_delete<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>_>
                      .
                      super__Head_base<0UL,_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_*,_false>
                      ._M_head_impl,
                   &((__args_1->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr)->hash,__args_1);
        std::
        _Rb_tree<uint256,std::pair<uint256_const,std::shared_ptr<CTransaction_const>>,std::_Select1st<std::pair<uint256_const,std::shared_ptr<CTransaction_const>>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::shared_ptr<CTransaction_const>>>>
        ::
        _M_emplace_unique<transaction_identifier<true>const&,std::shared_ptr<CTransaction_const>const&>
                  ((_Rb_tree<uint256,std::pair<uint256_const,std::shared_ptr<CTransaction_const>>,std::_Select1st<std::pair<uint256_const,std::shared_ptr<CTransaction_const>>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::shared_ptr<CTransaction_const>>>>
                    *)most_recent_block_txs._M_t.
                      super___uniq_ptr_impl<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>,_std::default_delete<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_*,_std::default_delete<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>_>
                      .
                      super__Head_base<0UL,_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_*,_false>
                      ._M_head_impl,
                   &((__args_1->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr)->m_witness_hash,__args_1);
      }
      UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
                (&criticalblock43,&this->m_most_recent_block_mutex,"m_most_recent_block_mutex",
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
                 ,0x8aa,false);
      *(undefined8 *)((this->m_most_recent_block_hash).super_base_blob<256U>.m_data._M_elems + 0x10)
           = hashBlock.super_base_blob<256U>.m_data._M_elems._16_8_;
      *(undefined8 *)((this->m_most_recent_block_hash).super_base_blob<256U>.m_data._M_elems + 0x18)
           = hashBlock.super_base_blob<256U>.m_data._M_elems._24_8_;
      *(undefined8 *)(this->m_most_recent_block_hash).super_base_blob<256U>.m_data._M_elems =
           hashBlock.super_base_blob<256U>.m_data._M_elems._0_8_;
      *(undefined8 *)((this->m_most_recent_block_hash).super_base_blob<256U>.m_data._M_elems + 8) =
           hashBlock.super_base_blob<256U>.m_data._M_elems._8_8_;
      std::__shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->m_most_recent_block).
                  super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>,
                 &pblock->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_ptr<const_CBlockHeaderAndShortTxIDs,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->m_most_recent_compact_block).
                  super___shared_ptr<const_CBlockHeaderAndShortTxIDs,_(__gnu_cxx::_Lock_policy)2>,
                 &pcmpctblock.
                  super___shared_ptr<const_CBlockHeaderAndShortTxIDs,_(__gnu_cxx::_Lock_policy)2>);
      __p = most_recent_block_txs;
      most_recent_block_txs._M_t.
      super___uniq_ptr_impl<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>,_std::default_delete<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_*,_std::default_delete<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>_>
      .
      super__Head_base<0UL,_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>,_std::default_delete<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>,_std::default_delete<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>_>
              )0x0;
      std::
      __uniq_ptr_impl<const_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>,_std::default_delete<const_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>_>
      ::reset((__uniq_ptr_impl<const_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>,_std::default_delete<const_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>_>
               *)&this->m_most_recent_block_txs,
              (pointer)__p._M_t.
                       super___uniq_ptr_impl<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>,_std::default_delete<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_*,_std::default_delete<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>_>
                       .
                       super__Head_base<0UL,_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_*,_false>
                       ._M_head_impl);
      std::unique_lock<std::mutex>::~unique_lock(&criticalblock43.super_unique_lock);
      std::
      unique_ptr<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>,_std::default_delete<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>_>
      ::~unique_ptr(&most_recent_block_txs);
      this_00 = this->m_connman;
      criticalblock43.super_unique_lock._M_device = (mutex_type *)0x0;
      criticalblock43.super_unique_lock._M_owns = false;
      criticalblock43.super_unique_lock._9_7_ = 0;
      criticalblock43.super_unique_lock._M_device = (mutex_type *)operator_new(0x20);
      ((criticalblock43.super_unique_lock._M_device)->super___mutex_base)._M_mutex.__align =
           (long)this;
      *(CBlockIndex **)
       ((long)&((criticalblock43.super_unique_lock._M_device)->super___mutex_base)._M_mutex + 8) =
           pindex;
      *(element_type ***)
       ((long)&((criticalblock43.super_unique_lock._M_device)->super___mutex_base)._M_mutex + 0x10)
           = &local_148;
      ((criticalblock43.super_unique_lock._M_device)->super___mutex_base)._M_mutex.__data.__list.
      __prev = (__pthread_internal_list *)&hashBlock;
      CConnman::ForEachNode(this_00,(NodeFn *)&criticalblock43);
      std::_Function_base::~_Function_base((_Function_base *)&criticalblock43);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_140);
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock42.super_unique_lock);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&pcmpctblock.
              super___shared_ptr<const_CBlockHeaderAndShortTxIDs,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::NewPoWValidBlock(const CBlockIndex *pindex, const std::shared_ptr<const CBlock>& pblock)
{
    auto pcmpctblock = std::make_shared<const CBlockHeaderAndShortTxIDs>(*pblock, FastRandomContext().rand64());

    LOCK(cs_main);

    if (pindex->nHeight <= m_highest_fast_announce)
        return;
    m_highest_fast_announce = pindex->nHeight;

    if (!DeploymentActiveAt(*pindex, m_chainman, Consensus::DEPLOYMENT_SEGWIT)) return;

    uint256 hashBlock(pblock->GetHash());
    const std::shared_future<CSerializedNetMsg> lazy_ser{
        std::async(std::launch::deferred, [&] { return NetMsg::Make(NetMsgType::CMPCTBLOCK, *pcmpctblock); })};

    {
        auto most_recent_block_txs = std::make_unique<std::map<uint256, CTransactionRef>>();
        for (const auto& tx : pblock->vtx) {
            most_recent_block_txs->emplace(tx->GetHash(), tx);
            most_recent_block_txs->emplace(tx->GetWitnessHash(), tx);
        }

        LOCK(m_most_recent_block_mutex);
        m_most_recent_block_hash = hashBlock;
        m_most_recent_block = pblock;
        m_most_recent_compact_block = pcmpctblock;
        m_most_recent_block_txs = std::move(most_recent_block_txs);
    }

    m_connman.ForEachNode([this, pindex, &lazy_ser, &hashBlock](CNode* pnode) EXCLUSIVE_LOCKS_REQUIRED(::cs_main) {
        AssertLockHeld(::cs_main);

        if (pnode->GetCommonVersion() < INVALID_CB_NO_BAN_VERSION || pnode->fDisconnect)
            return;
        ProcessBlockAvailability(pnode->GetId());
        CNodeState &state = *State(pnode->GetId());
        // If the peer has, or we announced to them the previous block already,
        // but we don't think they have this one, go ahead and announce it
        if (state.m_requested_hb_cmpctblocks && !PeerHasHeader(&state, pindex) && PeerHasHeader(&state, pindex->pprev)) {

            LogDebug(BCLog::NET, "%s sending header-and-ids %s to peer=%d\n", "PeerManager::NewPoWValidBlock",
                    hashBlock.ToString(), pnode->GetId());

            const CSerializedNetMsg& ser_cmpctblock{lazy_ser.get()};
            PushMessage(*pnode, ser_cmpctblock.Copy());
            state.pindexBestHeaderSent = pindex;
        }
    });
}